

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fix_storage_class.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::FixStorageClass::PropagateStorageClass
          (FixStorageClass *this,Instruction *inst,StorageClass storage_class,
          set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *seen)

{
  uint uVar1;
  Op OVar2;
  pointer ppIVar3;
  bool bVar4;
  bool bVar5;
  uint32_t uVar6;
  DefUseManager *this_00;
  pointer ppIVar7;
  pair<std::_Rb_tree_iterator<unsigned_int>,_bool> pVar8;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> uses;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  bVar4 = IsPointerResultType(this,inst);
  if (!bVar4) {
    return false;
  }
  bVar4 = IsPointerToStorageClass(this,inst,storage_class);
  OVar2 = inst->opcode_;
  if (bVar4) {
    if (OVar2 == OpPhi) {
      uVar6 = Instruction::result_id(inst);
      local_50._0_4_ = uVar6;
      pVar8 = std::
              _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
              ::_M_insert_unique<unsigned_int>(&seen->_M_t,(uint *)local_50._M_pod_data);
      if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        return false;
      }
    }
    uses.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    uses.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    uses.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_00 = Pass::get_def_use_mgr(&this->super_Pass);
    local_50._8_8_ = 0;
    local_38 = std::
               _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fix_storage_class.cpp:71:15)>
               ::_M_invoke;
    local_40 = std::
               _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fix_storage_class.cpp:71:15)>
               ::_M_manager;
    local_50._M_unused._M_object = &uses;
    analysis::DefUseManager::ForEachUser
              (this_00,inst,(function<void_(spvtools::opt::Instruction_*)> *)&local_50);
    if (local_40 != (code *)0x0) {
      (*local_40)(&local_50,&local_50,__destroy_functor);
    }
    ppIVar3 = uses.
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    bVar4 = false;
    for (ppIVar7 = uses.
                   super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppIVar7 != ppIVar3;
        ppIVar7 = ppIVar7 + 1) {
      bVar5 = PropagateStorageClass(this,*ppIVar7,storage_class,seen);
      bVar4 = (bool)(bVar4 | bVar5);
    }
    if (inst->opcode_ == OpPhi) {
      uVar6 = Instruction::result_id(inst);
      local_50._0_4_ = uVar6;
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::erase(&seen->_M_t,(key_type *)local_50._M_pod_data);
    }
    std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
    ~_Vector_base(&uses.
                   super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 );
    return bVar4;
  }
  uVar1 = OVar2 - OpFunctionCall;
  if (uVar1 < 0x1b) {
    if ((0xfdU >> (uVar1 & 0x1f) & 1) != 0) {
      return false;
    }
    if ((0x4000700U >> (uVar1 & 0x1f) & 1) != 0) goto LAB_004e779d;
  }
  if (OVar2 == OpBitcast) {
    return false;
  }
  if (OVar2 != OpSelect) {
    if (OVar2 == OpAllocateNodePayloadsAMDX) {
      return false;
    }
    if (OVar2 != OpPhi) {
      __assert_fail("false && \"Not expecting instruction to have a pointer result type.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fix_storage_class.cpp"
                    ,0x6e,
                    "bool spvtools::opt::FixStorageClass::PropagateStorageClass(Instruction *, spv::StorageClass, std::set<uint32_t> *)"
                   );
    }
  }
LAB_004e779d:
  FixInstructionStorageClass(this,inst,storage_class,seen);
  return true;
}

Assistant:

bool FixStorageClass::PropagateStorageClass(Instruction* inst,
                                            spv::StorageClass storage_class,
                                            std::set<uint32_t>* seen) {
  if (!IsPointerResultType(inst)) {
    return false;
  }

  if (IsPointerToStorageClass(inst, storage_class)) {
    if (inst->opcode() == spv::Op::OpPhi) {
      if (!seen->insert(inst->result_id()).second) {
        return false;
      }
    }

    bool modified = false;
    std::vector<Instruction*> uses;
    get_def_use_mgr()->ForEachUser(
        inst, [&uses](Instruction* use) { uses.push_back(use); });
    for (Instruction* use : uses) {
      modified |= PropagateStorageClass(use, storage_class, seen);
    }

    if (inst->opcode() == spv::Op::OpPhi) {
      seen->erase(inst->result_id());
    }
    return modified;
  }

  switch (inst->opcode()) {
    case spv::Op::OpAccessChain:
    case spv::Op::OpPtrAccessChain:
    case spv::Op::OpInBoundsAccessChain:
    case spv::Op::OpCopyObject:
    case spv::Op::OpPhi:
    case spv::Op::OpSelect:
      FixInstructionStorageClass(inst, storage_class, seen);
      return true;
    case spv::Op::OpFunctionCall:
      // We cannot be sure of the actual connection between the storage class
      // of the parameter and the storage class of the result, so we should not
      // do anything.  If the result type needs to be fixed, the function call
      // should be inlined.
      return false;
    case spv::Op::OpImageTexelPointer:
    case spv::Op::OpLoad:
    case spv::Op::OpStore:
    case spv::Op::OpCopyMemory:
    case spv::Op::OpCopyMemorySized:
    case spv::Op::OpVariable:
    case spv::Op::OpBitcast:
    case spv::Op::OpAllocateNodePayloadsAMDX:
      // Nothing to change for these opcode.  The result type is the same
      // regardless of the storage class of the operand.
      return false;
    default:
      assert(false &&
             "Not expecting instruction to have a pointer result type.");
      return false;
  }
}